

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeDisc.cpp
# Opt level: O1

void pzshape::TPZShapeDisc::Shape2D
               (REAL C,TPZVec<double> *X0,TPZVec<double> *X,int degree,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi,MShapeType type)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  TPZFMatrix<double> local_5510;
  double adStack_5480 [661];
  TPZFMatrix<double> local_3fd8;
  double local_3f48 [661];
  TPZFMatrix<double> local_2aa0;
  double local_2a10 [661];
  TPZFMatrix<double> local_1568;
  double local_14d8 [661];
  
  if (degree == 0) {
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    *phi->fElem = 1.0;
    if ((0 < (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow) &&
       (0 < (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
      *dphi->fElem = 0.0;
      if ((1 < (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow) &&
         (0 < (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
        dphi->fElem[1] = 0.0;
        return;
      }
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  dVar1 = *X0->fStore;
  dVar2 = X0->fStore[1];
  dVar3 = *X->fStore;
  dVar4 = X->fStore[1];
  local_3fd8.fElem = local_3f48;
  local_3fd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3fd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3fd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_3fd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_3fd8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018dedc8;
  local_3fd8.fSize = 0x294;
  local_3fd8.fGiven = local_3fd8.fElem;
  TPZVec<int>::TPZVec(&local_3fd8.fPivot.super_TPZVec<int>,0);
  local_3fd8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_3fd8.fPivot.super_TPZVec<int>.fStore = local_3fd8.fPivot.fExtAlloc;
  local_3fd8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3fd8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3fd8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_3fd8.fWork.fStore = (double *)0x0;
  local_3fd8.fWork.fNElements = 0;
  local_3fd8.fWork.fNAlloc = 0;
  local_3fd8.fElem = (double *)0x0;
  local_3fd8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018dead8;
  local_5510.fElem = adStack_5480;
  local_5510.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_5510.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_5510.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_5510.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_5510.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018dedc8;
  local_5510.fSize = 0x294;
  local_5510.fGiven = local_5510.fElem;
  TPZVec<int>::TPZVec(&local_5510.fPivot.super_TPZVec<int>,0);
  local_5510.fPivot.super_TPZVec<int>.fStore = local_5510.fPivot.fExtAlloc;
  local_5510.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_5510.fPivot.super_TPZVec<int>.fNElements = 0;
  local_5510.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_5510.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_5510.fWork.fStore = (double *)0x0;
  local_5510.fWork.fNElements = 0;
  local_5510.fWork.fNAlloc = 0;
  local_5510.fElem = (double *)0x0;
  local_5510.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018dead8;
  local_1568.fElem = local_14d8;
  local_1568.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_1568.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_1568.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1568.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1568.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018dedc8;
  local_1568.fSize = 0x294;
  local_1568.fGiven = local_1568.fElem;
  TPZVec<int>::TPZVec(&local_1568.fPivot.super_TPZVec<int>,0);
  local_1568.fPivot.super_TPZVec<int>.fStore = local_1568.fPivot.fExtAlloc;
  local_1568.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_1568.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1568.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1568.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_1568.fWork.fStore = (double *)0x0;
  local_1568.fWork.fNElements = 0;
  local_1568.fWork.fNAlloc = 0;
  local_1568.fElem = (double *)0x0;
  local_1568.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018dead8;
  local_2aa0.fElem = local_2a10;
  local_2aa0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_2aa0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_2aa0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_2aa0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_2aa0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018dedc8;
  local_2aa0.fSize = 0x294;
  local_2aa0.fGiven = local_2aa0.fElem;
  TPZVec<int>::TPZVec(&local_2aa0.fPivot.super_TPZVec<int>,0);
  local_2aa0.fPivot.super_TPZVec<int>.fStore = local_2aa0.fPivot.fExtAlloc;
  local_2aa0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_2aa0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_2aa0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_2aa0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_2aa0.fWork.fStore = (double *)0x0;
  local_2aa0.fWork.fNElements = 0;
  local_2aa0.fWork.fNAlloc = 0;
  local_2aa0.fElem = (double *)0x0;
  local_2aa0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018dead8;
  (*(code *)fOrthogonal)(C,dVar1,dVar3,degree,&local_3fd8,&local_1568,1);
  (*(code *)fOrthogonal)(C,dVar2,dVar4,degree,&local_5510,&local_2aa0);
  uVar8 = degree + 1;
  if ((type & ~ETensorialFull) == ETensorial) {
    iVar10 = uVar8 * uVar8;
  }
  else {
    iVar10 = (int)((degree + 2) * uVar8) / 2;
  }
  (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (phi,(long)iVar10,1);
  (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (dphi,2,(long)iVar10);
  (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])(phi);
  (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
            (dphi);
  if (type == EOrdemTotal) {
    if (-1 < degree) {
      lVar6 = 0;
      uVar9 = 0;
      do {
        iVar5 = (int)lVar6;
        lVar6 = (long)iVar5;
        uVar7 = uVar9 + 1;
        uVar11 = 0;
        do {
          if ((local_3fd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar11) ||
             (local_3fd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((((long)uVar9 < 0) ||
              (local_5510.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar9)) ||
             (local_5510.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar12 = lVar6 + uVar11;
          if (((lVar12 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar12))
             || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          phi->fElem[lVar6 + uVar11] = local_3fd8.fElem[uVar11] * local_5510.fElem[uVar9];
          if ((local_1568.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
             (local_1568.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar11)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((((long)uVar9 < 0) ||
              (local_5510.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar9)) ||
             (local_5510.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) || (lVar12 < 0)) ||
             ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar12)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar12] =
               local_1568.fElem
               [local_1568.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar11] *
               local_5510.fElem[uVar9];
          if ((local_3fd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar11) ||
             (local_3fd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((local_2aa0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
              ((long)uVar9 < 0)) ||
             (local_2aa0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar9)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) || (lVar12 < 0)) ||
             ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar12)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          dphi->fElem[lVar12 * (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + 1] =
               local_3fd8.fElem[uVar11] *
               local_2aa0.fElem[local_2aa0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar9]
          ;
          uVar11 = uVar11 + 1;
          uVar9 = uVar9 - 1;
        } while (uVar7 != uVar11);
        lVar6 = lVar6 + uVar11;
        uVar9 = uVar7;
      } while (uVar7 != uVar8);
      iVar5 = iVar5 + (int)uVar11;
      goto LAB_00fc8043;
    }
  }
  else if (-1 < degree) {
    uVar9 = 0;
    iVar5 = 0;
    do {
      if (uVar9 != 0) {
        lVar6 = (long)iVar5;
        uVar7 = 0;
        do {
          if ((local_3fd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar7) ||
             (local_3fd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_5510.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar9) ||
             (local_5510.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((lVar6 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar6)) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          phi->fElem[lVar6] = local_3fd8.fElem[uVar7] * local_5510.fElem[uVar9];
          if ((local_1568.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
             (local_1568.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar7)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_5510.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar9) ||
             (local_5510.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) || (lVar6 < 0)) ||
             ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar6)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar6] =
               local_1568.fElem[local_1568.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar7]
               * local_5510.fElem[uVar9];
          if ((local_3fd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar7) ||
             (local_3fd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_2aa0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
             (local_2aa0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar9)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) || (lVar6 < 0)) ||
             ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar6)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar6 + 1] =
               local_3fd8.fElem[uVar7] *
               local_2aa0.fElem[local_2aa0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar9]
          ;
          lVar6 = lVar6 + 1;
          uVar7 = uVar7 + 1;
        } while (uVar9 != uVar7);
        iVar5 = iVar5 + (int)uVar7;
      }
      if (uVar9 != 0) {
        lVar6 = (long)iVar5;
        uVar7 = 0;
        do {
          if ((local_3fd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar9) ||
             (local_3fd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_5510.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar7) ||
             (local_5510.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((lVar6 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar6)) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          phi->fElem[lVar6] = local_3fd8.fElem[uVar9] * local_5510.fElem[uVar7];
          if ((local_1568.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
             (local_1568.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar9)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_5510.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar7) ||
             (local_5510.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) || (lVar6 < 0)) ||
             ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar6)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar6] =
               local_1568.fElem[local_1568.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar9]
               * local_5510.fElem[uVar7];
          if ((local_3fd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar9) ||
             (local_3fd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_2aa0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
             (local_2aa0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar7)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) || (lVar6 < 0)) ||
             ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar6)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar6 + 1] =
               local_3fd8.fElem[uVar9] *
               local_2aa0.fElem[local_2aa0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar7]
          ;
          lVar6 = lVar6 + 1;
          uVar7 = uVar7 + 1;
        } while (uVar9 != uVar7);
        iVar5 = iVar5 + (int)uVar7;
      }
      if ((local_3fd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar9) ||
         (local_3fd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_5510.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar9) ||
         (local_5510.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar6 = (long)iVar5;
      if (((iVar5 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar6)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      phi->fElem[lVar6] = local_3fd8.fElem[uVar9] * local_5510.fElem[uVar9];
      if ((local_1568.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
         (local_1568.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar9)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_5510.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar9) ||
         (local_5510.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) || (iVar5 < 0)) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar6)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar6] =
           local_1568.fElem[local_1568.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar9] *
           local_5510.fElem[uVar9];
      if ((local_3fd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar9) ||
         (local_3fd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_2aa0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
         (local_2aa0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar9)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) || (iVar5 < 0)) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar6)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      dphi->fElem[lVar6 * (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + 1] =
           local_3fd8.fElem[uVar9] *
           local_2aa0.fElem[local_2aa0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar9];
      iVar5 = iVar5 + 1;
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar8);
    goto LAB_00fc8043;
  }
  iVar5 = 0;
LAB_00fc8043:
  if (iVar5 != iVar10) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZShapeDisc::Shape2D wrong shape count\n",0x28);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  dVar1 = *phi->fElem;
  if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  dVar2 = *dphi->fElem;
  if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  dVar3 = dphi->fElem[1];
  lVar6 = (long)(iVar10 + -1);
  if (((iVar10 < 1) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar6)) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *phi->fElem = phi->fElem[lVar6];
  if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) || (iVar10 < 1)) ||
     ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar6)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar12 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar12 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *dphi->fElem = dphi->fElem[lVar12 * lVar6];
  if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) || (iVar10 < 1)) ||
     ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar6)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar12 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar12 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  dphi->fElem[1] = dphi->fElem[lVar12 * lVar6 + 1];
  if (((0 < iVar10) && (lVar6 < (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow)) &&
     (0 < (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
    phi->fElem[lVar6] = dVar1;
    if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) || (iVar10 < 1)) ||
       ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar6)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar12 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dphi->fElem[lVar12 * lVar6] = dVar2;
    if (((1 < lVar12) && (0 < iVar10)) &&
       (lVar6 < (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
      dphi->fElem[lVar6 * (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + 1] = dVar3;
      TPZFMatrix<double>::~TPZFMatrix(&local_2aa0,&PTR_PTR_018ded90);
      TPZFMatrix<double>::~TPZFMatrix(&local_1568,&PTR_PTR_018ded90);
      TPZFMatrix<double>::~TPZFMatrix(&local_5510,&PTR_PTR_018ded90);
      TPZFMatrix<double>::~TPZFMatrix(&local_3fd8,&PTR_PTR_018ded90);
      return;
    }
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZShapeDisc::Shape2D(REAL C,TPZVec<REAL> &X0,TPZVec<REAL> &X,int degree,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi, MShapeType type){

  if(degree == 0) {
    phi(0,0) = 1.;
    dphi(0,0) = 0.;
    dphi(1,0) = 0.;
    return;
  }
  REAL x0 = X0[0];
  REAL y0 = X0[1];
  REAL x = X[0];
  REAL y = X[1];

  TPZFNMatrix<660> phix,phiy,dphix,dphiy;

  fOrthogonal(C,x0,x,degree,phix,dphix,1);
  fOrthogonal(C,y0,y,degree,phiy,dphiy,1);

  int i, j, ix, iy, counter=0, num = degree+1;

  int nshape = NShapeF(degree,2,type);
//  int count=num,ind=0;
  phi.Redim(nshape,1);
  dphi.Redim(2,nshape);
  phi.Zero();
  dphi.Zero();

  if(type==EOrdemTotal)
  {
  //mounts the shape function according to the max order:
  //  ____
  // |///
  // |//
  // |/

    for(i = 0; i <= degree; i++)
    {
       for(j = 0; j <= i; j++)
       {
          // notice that ix+iy is always constant for given i
          ix = j;
	  iy = i - j;
          phi(counter,0) = phix(ix,0)*phiy(iy,0);
          dphi(0,counter) = dphix(0,ix)*phiy(iy,0);
          dphi(1,counter) = phix(ix,0)*dphiy(0,iy);
          counter++;
       }
    }
  }else{
  // mounts the shape functions according to each
  // direction order
  // The functions are assembled in this sequence:
  // x functions, y functions, max xy
  // (horizontal, vertical lines and the 0 in the graph)
  // _____
  // |0|||
  // |-0||
  // |--0|
  // |---0
    // type == ETensorial
    for(i=0;i<num;i++)
    {
      for(j=0;j<i;j++)
      {
         ix = j;
	 iy = i;
         phi(counter,0) = phix(ix,0)*phiy(iy,0);
         dphi(0,counter) = dphix(0,ix)*phiy(iy,0);
         dphi(1,counter) = phix(ix,0)*dphiy(0,iy);
	 counter++;
      }
      for(j=0;j<i;j++)
      {
         ix = i;
	 iy = j;
         phi(counter,0) = phix(ix,0)*phiy(iy,0);
         dphi(0,counter) = dphix(0,ix)*phiy(iy,0);
         dphi(1,counter) = phix(ix,0)*dphiy(0,iy);
	 counter++;
      }

      ix = i;
      iy = i;
      phi(counter,0) = phix(ix,0)*phiy(iy,0);
      dphi(0,counter) = dphix(0,ix)*phiy(iy,0);
      dphi(1,counter) = phix(ix,0)*dphiy(0,iy);
      counter++;
    }
  }

  if(counter != nshape) {
    PZError << "TPZShapeDisc::Shape2D wrong shape count\n";
  }
  REAL phi0,dphi0[2];
  phi0 = phi(0,0);//here
  dphi0[0] = dphi(0,0);
  dphi0[1] = dphi(1,0);
  phi(0,0) = phi(nshape-1,0);//here
  dphi(0,0) = dphi(0,nshape-1);
  dphi(1,0) = dphi(1,nshape-1);

  phi(nshape-1,0) = phi0;//here
  dphi(0,nshape-1) = dphi0[0];
  dphi(1,nshape-1) = dphi0[1];
}